

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2.cpp
# Opt level: O0

uint8_t u_getCombiningClass_63(UChar32 c)

{
  UBool UVar1;
  int iVar2;
  Normalizer2 *pNVar3;
  Normalizer2 *nfd;
  uint local_10;
  UErrorCode errorCode;
  UChar32 c_local;
  
  nfd._4_4_ = U_ZERO_ERROR;
  local_10 = c;
  pNVar3 = icu_63::Normalizer2::getNFDInstance((UErrorCode *)((long)&nfd + 4));
  UVar1 = U_SUCCESS(nfd._4_4_);
  if (UVar1 == '\0') {
    errorCode._3_1_ = U_ZERO_ERROR >> 0x18;
  }
  else {
    iVar2 = (*(pNVar3->super_UObject)._vptr_UObject[10])(pNVar3,(ulong)local_10);
    errorCode._3_1_ = (undefined1)iVar2;
  }
  return errorCode._3_1_;
}

Assistant:

U_CAPI uint8_t U_EXPORT2
u_getCombiningClass(UChar32 c) {
    UErrorCode errorCode=U_ZERO_ERROR;
    const Normalizer2 *nfd=Normalizer2::getNFDInstance(errorCode);
    if(U_SUCCESS(errorCode)) {
        return nfd->getCombiningClass(c);
    } else {
        return 0;
    }
}